

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::
SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
::grow(SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
       *this,size_t MinSize)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  size_t sVar4;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *Dest;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *NewElts;
  size_t NewCapacity;
  size_t CurSize;
  size_t CurCapacity;
  size_t MinSize_local;
  SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
  *this_local;
  
  sVar4 = SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
          ::capacity(&this->
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                    );
  pvVar1 = (this->
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
           ).super_SmallVectorBase.EndX;
  pvVar2 = (this->
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
           ).super_SmallVectorBase.BeginX;
  NewElts = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
             *)NextPowerOf2(sVar4 + 2);
  if (NewElts < MinSize) {
    NewElts = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
               *)MinSize;
  }
  Dest = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
          *)malloc((long)NewElts * 0x2f8);
  SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<290u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>,false>
  ::
  uninitialized_move<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp___<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>*>
            ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
              *)(this->
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                ).super_SmallVectorBase.BeginX,
             (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
              *)(this->
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                ).super_SmallVectorBase.EndX,Dest);
  destroy_range((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                 *)(this->
                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                   ).super_SmallVectorBase.BeginX,
                (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                 *)(this->
                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                   ).super_SmallVectorBase.EndX);
  bVar3 = SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
          ::isSmall(&this->
                     super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                   );
  if (!bVar3) {
    free((this->
         super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
         ).super_SmallVectorBase.BeginX);
  }
  SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
  ::setEnd(&this->
            super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
           ,Dest + ((long)pvVar1 - (long)pvVar2) / 0x2f8);
  (this->
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
  ).super_SmallVectorBase.BeginX = Dest;
  (this->
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
  ).super_SmallVectorBase.CapacityX =
       (void *)((long)(this->
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                      ).super_SmallVectorBase.BeginX + (long)NewElts * 0x2f8);
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}